

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O2

TxfmFunc inv_txfm_type_to_func(TXFM_TYPE txfm_type)

{
  if (txfm_type < 0xc) {
    return (TxfmFunc)(&PTR_av1_idct4_0054bf20)[txfm_type];
  }
  return (TxfmFunc)0x0;
}

Assistant:

static inline TxfmFunc inv_txfm_type_to_func(TXFM_TYPE txfm_type) {
  switch (txfm_type) {
    case TXFM_TYPE_DCT4: return av1_idct4;
    case TXFM_TYPE_DCT8: return av1_idct8;
    case TXFM_TYPE_DCT16: return av1_idct16;
    case TXFM_TYPE_DCT32: return av1_idct32;
    case TXFM_TYPE_DCT64: return av1_idct64;
    case TXFM_TYPE_ADST4: return av1_iadst4;
    case TXFM_TYPE_ADST8: return av1_iadst8;
    case TXFM_TYPE_ADST16: return av1_iadst16;
    case TXFM_TYPE_IDENTITY4: return av1_iidentity4_c;
    case TXFM_TYPE_IDENTITY8: return av1_iidentity8_c;
    case TXFM_TYPE_IDENTITY16: return av1_iidentity16_c;
    case TXFM_TYPE_IDENTITY32: return av1_iidentity32_c;
    default: assert(0); return NULL;
  }
}